

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

int __thiscall MeshLib::Solid::copy(Solid *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  double dVar1;
  Node<MeshLib::Vertex> *pNVar2;
  bool bVar3;
  int extraout_EAX;
  Vertex *this_00;
  Point *pPVar4;
  Point *pPVar5;
  bool *pbVar6;
  Face *this_01;
  HalfEdge **ppHVar7;
  Vertex **ppVVar8;
  int *piVar9;
  tFace this_02;
  string *psVar10;
  string *psVar11;
  Face *F;
  int i;
  int v_1 [3];
  HalfEdge *he;
  Face *f;
  TreeIterator<MeshLib::Face> fiter;
  Vertex *w;
  Vertex *v;
  undefined1 local_130 [8];
  TreeIterator<MeshLib::Vertex> viter;
  Solid *solid_local;
  Solid *this_local;
  
  viter.m_root = (Node<MeshLib::Vertex> *)dst;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator
            ((TreeIterator<MeshLib::Vertex> *)local_130,&this->m_verts);
  while( true ) {
    bVar3 = AVL::TreeIterator<MeshLib::Vertex>::end((TreeIterator<MeshLib::Vertex> *)local_130);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    this_00 = AVL::TreeIterator<MeshLib::Vertex>::operator*
                        ((TreeIterator<MeshLib::Vertex> *)local_130);
    pNVar2 = viter.m_root;
    piVar9 = Vertex::id(this_00);
    fiter.m_root = (Node<MeshLib::Face> *)createVertex((Solid *)pNVar2,*piVar9);
    pPVar4 = Vertex::point(this_00);
    pPVar5 = Vertex::point((Vertex *)fiter.m_root);
    pPVar5->v[2] = pPVar4->v[2];
    dVar1 = pPVar4->v[1];
    pPVar5->v[0] = pPVar4->v[0];
    pPVar5->v[1] = dVar1;
    psVar10 = Vertex::string_abi_cxx11_(this_00);
    psVar11 = Vertex::string_abi_cxx11_((Vertex *)fiter.m_root);
    std::__cxx11::string::operator=((string *)psVar11,(string *)psVar10);
    pbVar6 = Vertex::boundary(this_00);
    bVar3 = *pbVar6;
    pbVar6 = Vertex::boundary((Vertex *)fiter.m_root);
    *pbVar6 = (bool)(bVar3 & 1);
    AVL::TreeIterator<MeshLib::Vertex>::operator++((TreeIterator<MeshLib::Vertex> *)local_130);
  }
  AVL::TreeIterator<MeshLib::Vertex>::~TreeIterator((TreeIterator<MeshLib::Vertex> *)local_130);
  AVL::TreeIterator<MeshLib::Face>::TreeIterator((TreeIterator<MeshLib::Face> *)&f,&this->m_faces);
  while( true ) {
    bVar3 = AVL::TreeIterator<MeshLib::Face>::end((TreeIterator<MeshLib::Face> *)&f);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    this_01 = AVL::TreeIterator<MeshLib::Face>::operator*((TreeIterator<MeshLib::Face> *)&f);
    ppHVar7 = Face::halfedge(this_01);
    v_1._4_8_ = *ppHVar7;
    for (F._0_4_ = 0; pNVar2 = viter.m_root, (int)F < 3; F._0_4_ = (int)F + 1) {
      ppVVar8 = HalfEdge::vertex((HalfEdge *)v_1._4_8_);
      piVar9 = Vertex::id(*ppVVar8);
      *(int *)((long)&F + (long)(int)F * 4 + 4) = *piVar9;
      ppHVar7 = HalfEdge::he_next((HalfEdge *)v_1._4_8_);
      v_1._4_8_ = *ppHVar7;
    }
    piVar9 = Face::id(this_01);
    this_02 = createFace((Solid *)pNVar2,(int *)((long)&F + 4),*piVar9);
    psVar10 = Face::string_abi_cxx11_(this_01);
    psVar11 = Face::string_abi_cxx11_(this_02);
    std::__cxx11::string::operator=((string *)psVar11,(string *)psVar10);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&f);
  }
  AVL::TreeIterator<MeshLib::Face>::~TreeIterator((TreeIterator<MeshLib::Face> *)&f);
  labelBoundaryEdges((Solid *)viter.m_root);
  return extraout_EAX;
}

Assistant:

void Solid::copy( Solid & solid )
{	
	for(AVL::TreeIterator<Vertex> viter(m_verts); !viter.end(); ++viter)
	{
		Vertex * v = *viter;
		Vertex * w = solid.createVertex( v->id() );

		w->point() = v->point();
		w->string()= v->string();
		w->boundary() = v->boundary();
	}

	for(AVL::TreeIterator<Face> fiter(m_faces); !fiter.end(); ++fiter)
	{
		Face * f = *fiter;

		HalfEdge * he = f->halfedge();
		int v[3];

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->vertex()->id();
			he = he->he_next();
		}

		Face * F = solid.createFace(v, f->id() );
		F->string() = f->string();
	}

	solid.labelBoundaryEdges();

}